

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qsbr.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_25d63::QSBR_TwoThreadsDeallocateBeforeQuittingPointerStaysLive_Test::TestBody
          (QSBR_TwoThreadsDeallocateBeforeQuittingPointerStaysLive_Test *this)

{
  reference this_00;
  void *__stat_loc;
  id local_28;
  qsbr_thread local_20;
  qsbr_thread second_thread;
  char *ptr;
  QSBR_TwoThreadsDeallocateBeforeQuittingPointerStaysLive_Test *this_local;
  
  local_28._M_thread = (native_handle_type)unodb::test::QSBRTestBase::allocate();
  second_thread.super_thread._M_id._M_thread = (thread)(thread)local_28._M_thread;
  unodb::qsbr_thread::
  qsbr_thread<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_laurynas_biveinis[P]unodb_test_test_qsbr_cpp:754:36)>
            (&local_20,(type *)&local_28);
  __stat_loc = (void *)0x0;
  this_00 = std::array<unodb::detail::thread_sync,_6UL>::operator[]
                      ((array<unodb::detail::thread_sync,_6UL> *)unodb::detail::thread_syncs,0);
  unodb::detail::thread_sync::wait(this_00,__stat_loc);
  unodb::test::QSBRTestBase::join(&local_20);
  unodb::test::QSBRTestBase::touch_memory((char *)second_thread.super_thread._M_id._M_thread,'\0');
  unodb::test::QSBRTestBase::quiescent();
  unodb::qsbr_thread::~qsbr_thread(&local_20);
  return;
}

Assistant:

UNODB_TEST_F(QSBR, TwoThreadsDeallocateBeforeQuittingPointerStaysLive) {
  auto *ptr = static_cast<char *>(allocate());

  unodb::qsbr_thread second_thread{[ptr] {
    qsbr_deallocate(ptr);
    thread_syncs[0].notify();  // 1 ->
  }};

  thread_syncs[0].wait();  // 1 <-
  join(second_thread);

  touch_memory(ptr);

  quiescent();
}